

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolMACEthernet.cpp
# Opt level: O2

ostream * operator<<(ostream *out,ProtocolMACEthernet *obj)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  char *pcVar3;
  undefined4 extraout_var_00;
  
  std::operator<<(out,"MAC Configuration\n");
  poVar2 = std::operator<<(out,"   Ethernet Unicast MAC Address: ");
  iVar1 = (*(obj->super_InterfaceMAC)._vptr_InterfaceMAC[5])(obj);
  pcVar3 = macaddrtoa((uint8_t *)CONCAT44(extraout_var,iVar1));
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(out,"   Ethernet Broadcast MAC Address: ");
  iVar1 = (*(obj->super_InterfaceMAC)._vptr_InterfaceMAC[6])(obj);
  pcVar3 = macaddrtoa((uint8_t *)CONCAT44(extraout_var_00,iVar1));
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,"\n");
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const ProtocolMACEthernet& obj)
{
    out << "MAC Configuration\n";
    out << "   Ethernet Unicast MAC Address: " << macaddrtoa(obj.GetUnicastAddress()) << "\n";
    out << "   Ethernet Broadcast MAC Address: " << macaddrtoa(obj.GetBroadcastAddress()) << "\n";
    return out;
}